

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_assign.hpp
# Opt level: O0

void remora::kernels::detail::
     matrix_assign<remora::dense_matrix_adaptor<double,remora::row_major,remora::continuous_dense_tag,remora::cpu_tag>,remora::dense_matrix_adaptor<double_const,remora::column_major,remora::continuous_dense_tag,remora::cpu_tag>,remora::column_major,remora::dense_tag,remora::dense_tag,remora::cpu_tag>
               (undefined8 param_1,undefined8 param_2)

{
  bindings::
  matrix_assign<remora::dense_matrix_adaptor<double,remora::row_major,remora::continuous_dense_tag,remora::cpu_tag>,remora::dense_matrix_adaptor<double_const,remora::column_major,remora::continuous_dense_tag,remora::cpu_tag>>
            (param_1,param_2);
  return;
}

Assistant:

void matrix_assign(
	matrix_expression<M, Device>& m, 
	matrix_expression<E, Device> const& e,
	row_major, EOrientation ,TagE tagE, TagM tagM
) {
	typedef typename std::conditional<
		std::is_same<EOrientation, unknown_orientation>::value,
		row_major,
		typename E::orientation
	>::type Orientation;
	bindings::matrix_assign(m, e, typename M::orientation(), Orientation(), tagE, tagM);
}